

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  ArenaStringPtr *pAVar4;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_28,&local_30);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetString",CPPTYPE_STRING);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    psVar3 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),
                        *(string **)(field + 0x90));
  }
  else {
    bVar2 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
    if (bVar2) {
      psVar3 = (string *)GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
    }
    else {
      pAVar4 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      psVar3 = pAVar4->ptr_;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        return GetField<ArenaStringPtr>(message, field).Get();
      }
    }
  }
}